

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint LodePNGText_copy(LodePNGInfo *dest,LodePNGInfo *source)

{
  uint uVar1;
  long in_RSI;
  char *in_RDI;
  uint error;
  LodePNGInfo *unaff_retaddr;
  size_t i;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  in_RDI[0x50] = '\0';
  in_RDI[0x51] = '\0';
  in_RDI[0x52] = '\0';
  in_RDI[0x53] = '\0';
  in_RDI[0x54] = '\0';
  in_RDI[0x55] = '\0';
  in_RDI[0x56] = '\0';
  in_RDI[0x57] = '\0';
  in_RDI[0x58] = '\0';
  in_RDI[0x59] = '\0';
  in_RDI[0x5a] = '\0';
  in_RDI[0x5b] = '\0';
  in_RDI[0x5c] = '\0';
  in_RDI[0x5d] = '\0';
  in_RDI[0x5e] = '\0';
  in_RDI[0x5f] = '\0';
  in_RDI[0x48] = '\0';
  in_RDI[0x49] = '\0';
  in_RDI[0x4a] = '\0';
  in_RDI[0x4b] = '\0';
  in_RDI[0x4c] = '\0';
  in_RDI[0x4d] = '\0';
  in_RDI[0x4e] = '\0';
  in_RDI[0x4f] = '\0';
  local_20 = 0;
  while( true ) {
    if (local_20 == *(long *)(in_RSI + 0x48)) {
      return 0;
    }
    uVar1 = lodepng_add_text(unaff_retaddr,
                             (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             in_RDI);
    if (uVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  return uVar1;
}

Assistant:

static unsigned LodePNGText_copy(LodePNGInfo* dest, const LodePNGInfo* source) {
  size_t i = 0;
  dest->text_keys = NULL;
  dest->text_strings = NULL;
  dest->text_num = 0;
  for(i = 0; i != source->text_num; ++i) {
    CERROR_TRY_RETURN(lodepng_add_text(dest, source->text_keys[i], source->text_strings[i]));
  }
  return 0;
}